

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeExpression(ExpressionContext *ctx,SynBase *syntax)

{
  uint uVar1;
  ExprError *pEVar2;
  TypeBase *type;
  char *pcVar3;
  
  uVar1 = ctx->expressionDepth + 1;
  ctx->expressionDepth = uVar1;
  if (0x800 < uVar1) {
    anon_unknown.dwarf_b837c::Stop
              (ctx,syntax,"ERROR: reached maximum generic expression depth (%d)",0x800);
  }
  pEVar2 = (ExprError *)0x0;
  switch(syntax->typeID) {
  case 0:
    pEVar2 = (ExprError *)AnalyzeError(ctx,(SynError *)syntax);
    break;
  case 4:
    pEVar2 = (ExprError *)AnalyzeVariableAccess(ctx,(SynIdentifier *)syntax);
    break;
  case 5:
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar3 = "ERROR: cannot take typeid from auto type";
    goto LAB_0015e009;
  case 6:
    pcVar3 = "ERROR: cannot take typeid from generic type";
    goto LAB_0015e0a8;
  case 7:
    pEVar2 = (ExprError *)AnalyzeTypeSimple(ctx,(SynTypeSimple *)syntax);
    break;
  case 8:
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar3 = "ERROR: cannot take typeid from generic type";
LAB_0015e009:
    pEVar2 = anon_unknown.dwarf_b837c::ReportExpected(ctx,syntax,type,pcVar3);
    break;
  case 9:
    pEVar2 = (ExprError *)AnalyzeTypeArray(ctx,(SynTypeArray *)syntax);
    break;
  case 10:
    pEVar2 = (ExprError *)AnalyzeTypeReference(ctx,(SynTypeReference *)syntax);
    break;
  case 0xb:
    pEVar2 = (ExprError *)AnalyzeTypeFunction(ctx,(SynTypeFunction *)syntax);
    break;
  case 0xc:
    pEVar2 = (ExprError *)AnalyzeTypeGenericInstance(ctx,(SynTypeGenericInstance *)syntax);
    break;
  case 0xd:
    pEVar2 = (ExprError *)AnalyzeTypeof(ctx,(SynTypeof *)syntax);
    break;
  case 0xe:
    pEVar2 = (ExprError *)AnalyzeBool(ctx,(SynBool *)syntax);
    break;
  case 0xf:
    pEVar2 = (ExprError *)AnalyzeNumber(ctx,(SynNumber *)syntax);
    break;
  case 0x10:
    pEVar2 = (ExprError *)AnalyzeNullptr(ctx,(SynNullptr *)syntax);
    break;
  case 0x11:
    pEVar2 = (ExprError *)AnalyzeCharacter(ctx,(SynCharacter *)syntax);
    break;
  case 0x12:
    pEVar2 = (ExprError *)AnalyzeString(ctx,(SynString *)syntax);
    break;
  case 0x13:
    pEVar2 = (ExprError *)AnalyzeArray(ctx,(SynArray *)syntax);
    break;
  case 0x14:
    pEVar2 = (ExprError *)AnalyzeGenerator(ctx,(SynGenerator *)syntax);
    break;
  case 0x17:
    pEVar2 = (ExprError *)AnalyzeMemberAccess(ctx,(SynMemberAccess *)syntax);
    break;
  case 0x19:
    pEVar2 = (ExprError *)AnalyzeArrayIndex(ctx,(SynArrayIndex *)syntax);
    break;
  case 0x1a:
    pEVar2 = (ExprError *)AnalyzeFunctionCall(ctx,(SynFunctionCall *)syntax);
    break;
  case 0x1b:
    pEVar2 = (ExprError *)AnalyzePreModify(ctx,(SynPreModify *)syntax);
    break;
  case 0x1c:
    pEVar2 = (ExprError *)AnalyzePostModify(ctx,(SynPostModify *)syntax);
    break;
  case 0x1d:
    pEVar2 = (ExprError *)AnalyzeGetAddress(ctx,(SynGetAddress *)syntax);
    break;
  case 0x1e:
    pEVar2 = (ExprError *)AnalyzeDereference(ctx,(SynDereference *)syntax);
    break;
  case 0x1f:
    pEVar2 = (ExprError *)AnalyzeSizeof(ctx,(SynSizeof *)syntax);
    break;
  case 0x20:
    pEVar2 = (ExprError *)AnalyzeNew(ctx,(SynNew *)syntax);
    break;
  case 0x21:
    pEVar2 = (ExprError *)AnalyzeConditional(ctx,(SynConditional *)syntax);
    break;
  case 0x2f:
    pEVar2 = (ExprError *)AnalyzeUnaryOp(ctx,(SynUnaryOp *)syntax);
    break;
  case 0x30:
    pEVar2 = (ExprError *)AnalyzeBinaryOp(ctx,(SynBinaryOp *)syntax);
    break;
  case 0x31:
    pEVar2 = (ExprError *)AnalyzeAssignment(ctx,(SynAssignment *)syntax);
    break;
  case 0x32:
    pEVar2 = (ExprError *)AnalyzeModifyAssignment(ctx,(SynModifyAssignment *)syntax);
    break;
  case 0x37:
    pEVar2 = (ExprError *)
             AnalyzeFunctionDefinition
                       (ctx,(SynFunctionDefinition *)syntax,(FunctionData *)0x0,(TypeFunction *)0x0,
                        (TypeBase *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),true,true,true);
    break;
  case 0x39:
    pEVar2 = (ExprError *)AnalyzeShortFunctionDefinition(ctx,(SynShortFunctionDefinition *)syntax);
  }
  ctx->expressionDepth = ctx->expressionDepth - 1;
  if (pEVar2 != (ExprError *)0x0) {
    return &pEVar2->super_ExprBase;
  }
  pcVar3 = "ERROR: unknown expression type";
LAB_0015e0a8:
  anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar3);
}

Assistant:

ExprBase* AnalyzeExpression(ExpressionContext &ctx, SynBase *syntax)
{
	ctx.expressionDepth++;

	if(ctx.expressionDepth > NULLC_MAX_EXPRESSION_DEPTH)
		Stop(ctx, syntax, "ERROR: reached maximum generic expression depth (%d)", NULLC_MAX_EXPRESSION_DEPTH);

	ExprBase *result = NULL;

	switch(syntax->typeID)
	{
	case SynBool::myTypeID:
		result = AnalyzeBool(ctx, (SynBool*)syntax);
		break;
	case SynCharacter::myTypeID:
		result = AnalyzeCharacter(ctx, (SynCharacter*)syntax);
		break;
	case SynString::myTypeID:
		result = AnalyzeString(ctx, (SynString*)syntax);
		break;
	case SynNullptr::myTypeID:
		result = AnalyzeNullptr(ctx, (SynNullptr*)syntax);
		break;
	case SynNumber::myTypeID:
		result = AnalyzeNumber(ctx, (SynNumber*)syntax);
		break;
	case SynArray::myTypeID:
		result = AnalyzeArray(ctx, (SynArray*)syntax);
		break;
	case SynPreModify::myTypeID:
		result = AnalyzePreModify(ctx, (SynPreModify*)syntax);
		break;
	case SynPostModify::myTypeID:
		result = AnalyzePostModify(ctx, (SynPostModify*)syntax);
		break;
	case SynUnaryOp::myTypeID:
		result = AnalyzeUnaryOp(ctx, (SynUnaryOp*)syntax);
		break;
	case SynBinaryOp::myTypeID:
		result = AnalyzeBinaryOp(ctx, (SynBinaryOp*)syntax);
		break;
	case SynGetAddress::myTypeID:
		result = AnalyzeGetAddress(ctx, (SynGetAddress*)syntax);
		break;
	case SynDereference::myTypeID:
		result = AnalyzeDereference(ctx, (SynDereference*)syntax);
		break;
	case SynTypeof::myTypeID:
		result = AnalyzeTypeof(ctx, (SynTypeof*)syntax);
		break;
	case SynIdentifier::myTypeID:
		result = AnalyzeVariableAccess(ctx, (SynIdentifier*)syntax);
		break;
	case SynTypeSimple::myTypeID:
		result = AnalyzeTypeSimple(ctx, (SynTypeSimple*)syntax);
		break;
	case SynSizeof::myTypeID:
		result = AnalyzeSizeof(ctx, (SynSizeof*)syntax);
		break;
	case SynConditional::myTypeID:
		result = AnalyzeConditional(ctx, (SynConditional*)syntax);
		break;
	case SynAssignment::myTypeID:
		result = AnalyzeAssignment(ctx, (SynAssignment*)syntax);
		break;
	case SynModifyAssignment::myTypeID:
		result = AnalyzeModifyAssignment(ctx, (SynModifyAssignment*)syntax);
		break;
	case SynMemberAccess::myTypeID:
		result = AnalyzeMemberAccess(ctx, (SynMemberAccess*)syntax);
		break;
	case SynTypeArray::myTypeID:
		result = AnalyzeTypeArray(ctx, (SynTypeArray*)syntax);
		break;
	case SynArrayIndex::myTypeID:
		result = AnalyzeArrayIndex(ctx, (SynArrayIndex*)syntax);
		break;
	case SynFunctionCall::myTypeID:
		result = AnalyzeFunctionCall(ctx, (SynFunctionCall*)syntax);
		break;
	case SynNew::myTypeID:
		result = AnalyzeNew(ctx, (SynNew*)syntax);
		break;
	case SynFunctionDefinition::myTypeID:
		result = AnalyzeFunctionDefinition(ctx, (SynFunctionDefinition*)syntax, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, true, true);
		break;
	case SynGenerator::myTypeID:
		result = AnalyzeGenerator(ctx, (SynGenerator*)syntax);
		break;
	case SynTypeReference::myTypeID:
		result = AnalyzeTypeReference(ctx, (SynTypeReference*)syntax);
		break;
	case SynTypeFunction::myTypeID:
		result = AnalyzeTypeFunction(ctx, (SynTypeFunction*)syntax);
		break;
	case SynTypeGenericInstance::myTypeID:
		result = AnalyzeTypeGenericInstance(ctx, (SynTypeGenericInstance*)syntax);
		break;
	case SynShortFunctionDefinition::myTypeID:
		result = AnalyzeShortFunctionDefinition(ctx, (SynShortFunctionDefinition*)syntax);
		break;
	case SynTypeAuto::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from auto type");
		break;
	case SynTypeAlias::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from generic type");
		break;
	case SynTypeGeneric::myTypeID:
		Stop(ctx, syntax, "ERROR: cannot take typeid from generic type");

		break;
	case SynError::myTypeID:
		result = AnalyzeError(ctx, (SynError*)syntax);
		break;
	default:
		break;
	}

	ctx.expressionDepth--;

	if(!result)
		Stop(ctx, syntax, "ERROR: unknown expression type");

	return result;
}